

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O0

void avro::codec_traits<testgen::_bigrecord_Union__1__>::decode(Decoder *d,_bigrecord_Union__1__ *v)

{
  _bigrecord_Union__1__ *this;
  undefined8 uVar1;
  long *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vv;
  size_t n;
  string *in_stack_ffffffffffffff78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *t;
  Exception *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  this = (_bigrecord_Union__1__ *)(**(code **)(*in_RDI + 0xb0))();
  if (this < (_bigrecord_Union__1__ *)0x2) {
    if (this == (_bigrecord_Union__1__ *)0x0) {
      t = &local_68;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2c555a);
      decode<std::vector<unsigned_char,std::allocator<unsigned_char>>>((Decoder *)this,t);
      testgen::_bigrecord_Union__1__::set_bytes(this,t);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff90)
      ;
    }
    else if (this == (_bigrecord_Union__1__ *)0x1) {
      (**(code **)(*in_RDI + 0x18))();
      testgen::_bigrecord_Union__1__::set_null(this);
    }
    return;
  }
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
  uVar1 = __cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffffb4,uVar2));
  Exception::Exception(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void decode(Decoder& d, testgen::_bigrecord_Union__1__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            {
                std::vector<uint8_t> vv;
                avro::decode(d, vv);
                v.set_bytes(vv);
            }
            break;
        case 1:
            d.decodeNull();
            v.set_null();
            break;
        }
    }